

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRules
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar1;
  cmMakefile *this_01;
  TargetType targetType;
  int iVar2;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  undefined4 extraout_var;
  cmOutputConverter *outputConverter;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator_type local_402;
  allocator<char> local_401;
  string local_400;
  cmAlphaNum local_3e0;
  string compileCmd;
  string local_390;
  undefined1 local_370 [48];
  string flags;
  string local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  string local_2e8;
  cmNinjaRule rule;
  RuleVariables vars;
  string local_50;
  cmRulePlaceholderExpander *this_02;
  
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  LanguageLinkerCudaDeviceRule(&local_50,this,config);
  cmNinjaRule::cmNinjaRule(&rule,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compileCmd,"CMAKE_CUDA_DEVICE_LINKER",(allocator<char> *)&local_320);
  psVar3 = cmMakefile::GetRequiredDefinition(this_00,&compileCmd);
  vars.CMTargetType = (psVar3->_M_dataplus)._M_p;
  vars.CMTargetName = (char *)psVar3->_M_string_length;
  local_3e0.View_._M_len = 0x22;
  local_3e0.View_._M_str = " -arch=$ARCH $REGISTER -o=$out $in";
  cmStrCat<>(&flags,(cmAlphaNum *)&vars,&local_3e0);
  __l._M_len = 1;
  __l._M_array = &flags;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_400,__l,(allocator_type *)&local_2e8);
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_370,pcVar1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_400,config,config,&local_390,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)local_370);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_400);
  std::__cxx11::string::~string((string *)&flags);
  std::__cxx11::string::~string((string *)&compileCmd);
  std::__cxx11::string::assign((char *)&rule.Comment);
  std::__cxx11::string::assign((char *)&rule.Description);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,&rule);
  memset(&vars,0,0x150);
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  vars.CMTargetName = (psVar3->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  psVar3 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  vars.CMTargetType = (psVar3->_M_dataplus)._M_p;
  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"CUDA",(allocator<char> *)&compileCmd);
  local_370._0_8_ = local_370 + 0x10;
  local_370._8_8_ = (char *)0x0;
  local_370[0x10] = '\0';
  cmCommonTargetGenerator::GetFlags
            (&flags,(cmCommonTargetGenerator *)this,(string *)&local_3e0,config,(string *)local_370)
  ;
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::~string((string *)&local_3e0);
  vars.Flags = flags._M_dataplus._M_p;
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"CMAKE_CUDA_DEVICE_LINK_COMPILE",(allocator<char> *)local_370);
  psVar3 = cmMakefile::GetRequiredDefinition(this_01,(string *)&local_3e0);
  std::__cxx11::string::string((string *)&compileCmd,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_3e0);
  iVar2 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
            super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
  this_02 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar2);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  outputConverter =
       &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmRulePlaceholderExpander::ExpandRuleVariables(this_02,outputConverter,&compileCmd,&vars);
  LanguageLinkerCudaDeviceCompileRule((string *)&local_3e0,this,config);
  std::__cxx11::string::operator=((string *)&rule,(string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  std::__cxx11::string::string((string *)local_370,(string *)&compileCmd);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_370;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_400,__l_00,(allocator_type *)&local_320);
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)&local_3e0,pcVar1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_400,config,config,&local_390,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_400);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::assign((char *)&rule.Comment);
  std::__cxx11::string::assign((char *)&rule.Description);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,&rule);
  LanguageLinkerCudaFatbinaryRule((string *)&local_3e0,this,config);
  std::__cxx11::string::operator=((string *)&rule,(string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"CMAKE_CUDA_FATBINARY",&local_401);
  psVar3 = cmMakefile::GetRequiredDefinition(this_00,&local_320);
  local_3e0.View_._M_str = (psVar3->_M_dataplus)._M_p;
  local_3e0.View_._M_len = psVar3->_M_string_length;
  local_370._0_8_ = (pointer)0x51;
  local_370._8_8_ =
       " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$out $PROFILES";
  cmStrCat<>(&local_400,&local_3e0,(cmAlphaNum *)local_370);
  __l_01._M_len = 1;
  __l_01._M_array = &local_400;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_300,__l_01,&local_402);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_390,pcVar1,&local_300,config,config,&local_2e8,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_300);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::assign((char *)&rule.Comment);
  std::__cxx11::string::assign((char *)&rule.Description);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,&rule);
  (*(this_02->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_02);
  std::__cxx11::string::~string((string *)&compileCmd);
  std::__cxx11::string::~string((string *)&flags);
  cmNinjaRule::~cmNinjaRule(&rule);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRules(
  const std::string& config)
{
  const cmMakefile* mf = this->GetMakefile();

  cmNinjaRule rule(this->LanguageLinkerCudaDeviceRule(config));
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
               " -arch=$ARCH $REGISTER -o=$out $in") },
    config, config);
  rule.Comment = "Rule for CUDA device linking.";
  rule.Description = "Linking CUDA $out";
  this->GetGlobalGenerator()->AddRule(rule);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";

  std::string flags = this->GetFlags("CUDA", config);
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetMakefile()->GetRequiredDefinition(
    "CMAKE_CUDA_DEVICE_LINK_COMPILE");
  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());
  rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                               compileCmd, vars);

  rule.Name = this->LanguageLinkerCudaDeviceCompileRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine({ compileCmd },
                                                             config, config);
  rule.Comment = "Rule for compiling CUDA device stubs.";
  rule.Description = "Compiling CUDA device stub $out";
  this->GetGlobalGenerator()->AddRule(rule);

  rule.Name = this->LanguageLinkerCudaFatbinaryRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
               " -64 -cmdline=--compile-only -compress-all -link "
               "--embedded-fatbin=$out $PROFILES") },
    config, config);
  rule.Comment = "Rule for CUDA fatbinaries.";
  rule.Description = "Creating fatbinary $out";
  this->GetGlobalGenerator()->AddRule(rule);
}